

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_post_effects.cpp
# Opt level: O2

void __thiscall
ON_PostEffects::GetPostEffects
          (ON_PostEffects *this,Types type,ON_SimpleArray<const_ON_PostEffect_*> *a)

{
  undefined4 in_register_00000034;
  long lVar1;
  int i;
  long lVar2;
  ON_SimpleArray<ON_PostEffect_*> pel;
  ON_SimpleArray<ON_PostEffect_*> local_30;
  
  local_30._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0082a658;
  local_30.m_a = (ON_PostEffect **)0x0;
  local_30.m_count = 0;
  local_30.m_capacity = 0;
  (*this->_vptr_ON_PostEffects[7])(this,CONCAT44(in_register_00000034,type));
  lVar1 = 0;
  for (lVar2 = 0; lVar2 < local_30.m_count; lVar2 = lVar2 + 1) {
    ON_SimpleArray<const_ON_PostEffect_*>::Append(a,(ON_PostEffect **)((long)local_30.m_a + lVar1));
    lVar1 = lVar1 + 8;
  }
  ON_SimpleArray<ON_PostEffect_*>::~ON_SimpleArray(&local_30);
  return;
}

Assistant:

void ON_PostEffects::GetPostEffects(ON_PostEffect::Types type, ON_SimpleArray<const ON_PostEffect*>& a) const
{
  ON_SimpleArray<ON_PostEffect*> pel;
  const_cast<ON_PostEffects*>(this)->GetPostEffects(type, pel);
  for (int i = 0; i < pel.Count(); i++)
  {
    a.Append(pel[i]);
  }
}